

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O0

FT_Error tt_face_load_font_dir(TT_Face face,FT_Stream stream)

{
  FT_Memory memory_00;
  bool bVar1;
  FT_UInt32 FVar2;
  TT_Table pTVar3;
  ulong uVar4;
  ushort local_6a;
  FT_Bool duplicate;
  FT_UShort i;
  TT_TableRec entry;
  FT_UShort valid_entries;
  FT_UShort nn;
  FT_Memory memory;
  undefined1 auStack_30 [4];
  FT_Error error;
  SFNT_HeaderRec sfnt;
  FT_Stream stream_local;
  TT_Face face_local;
  
  memory_00 = stream->memory;
  entry.Length._4_2_ = 0;
  sfnt.offset = (FT_ULong)stream;
  sfnt._8_8_ = FT_Stream_Pos(stream);
  FVar2 = FT_Stream_ReadULong((FT_Stream)sfnt.offset,(FT_Error *)((long)&memory + 4));
  _auStack_30 = (ulong)FVar2;
  if ((memory._4_4_ == 0) &&
     (memory._4_4_ = FT_Stream_ReadFields
                               ((FT_Stream)sfnt.offset,tt_face_load_font_dir::offset_table_fields,
                                auStack_30), memory._4_4_ == 0)) {
    if (_auStack_30 == 0x4f54544f) {
      entry.Length._4_2_ = (FT_UShort)sfnt.format_tag;
      if ((FT_UShort)sfnt.format_tag == 0) {
        return 2;
      }
    }
    else {
      memory._4_4_ = check_table_dir((SFNT_Header)auStack_30,(FT_Stream)sfnt.offset,
                                     (FT_UShort *)((long)&entry.Length + 4));
      if (memory._4_4_ != 0) {
        return memory._4_4_;
      }
    }
    face->num_tables = entry.Length._4_2_;
    face->format_tag = _auStack_30;
    pTVar3 = (TT_Table)
             ft_mem_qrealloc(memory_00,0x20,0,(ulong)face->num_tables,(void *)0x0,
                             (FT_Error *)((long)&memory + 4));
    face->dir_tables = pTVar3;
    if (((memory._4_4_ == 0) &&
        (memory._4_4_ = FT_Stream_Seek((FT_Stream)sfnt.offset,sfnt._8_8_ + 0xc), memory._4_4_ == 0))
       && (memory._4_4_ = FT_Stream_EnterFrame
                                    ((FT_Stream)sfnt.offset,(ulong)(FT_UShort)sfnt.format_tag << 4),
          memory._4_4_ == 0)) {
      entry.Length._4_2_ = 0;
      for (entry.Length._6_2_ = 0; entry.Length._6_2_ < (FT_UShort)sfnt.format_tag;
          entry.Length._6_2_ = entry.Length._6_2_ + 1) {
        FVar2 = FT_Stream_GetULong((FT_Stream)sfnt.offset);
        uVar4 = (ulong)FVar2;
        FVar2 = FT_Stream_GetULong((FT_Stream)sfnt.offset);
        entry.Tag = (FT_ULong)FVar2;
        FVar2 = FT_Stream_GetULong((FT_Stream)sfnt.offset);
        entry.CheckSum = (FT_ULong)FVar2;
        FVar2 = FT_Stream_GetULong((FT_Stream)sfnt.offset);
        entry.Offset = (FT_ULong)FVar2;
        if (entry.CheckSum <= *(ulong *)(sfnt.offset + 8)) {
          if (*(long *)(sfnt.offset + 8) - entry.CheckSum < entry.Offset) {
            if ((uVar4 != 0x686d7478) && (uVar4 != 0x766d7478)) goto LAB_0032df84;
            entry.Offset = *(long *)(sfnt.offset + 8) - entry.CheckSum & 0xfffffffc;
          }
          bVar1 = false;
          for (local_6a = 0; local_6a < entry.Length._4_2_; local_6a = local_6a + 1) {
            if (face->dir_tables[local_6a].Tag == uVar4) {
              bVar1 = true;
              break;
            }
          }
          if (!bVar1) {
            pTVar3 = face->dir_tables + entry.Length._4_2_;
            pTVar3->Tag = uVar4;
            pTVar3->CheckSum = entry.Tag;
            pTVar3->Offset = entry.CheckSum;
            pTVar3->Length = entry.Offset;
            entry.Length._4_2_ = entry.Length._4_2_ + 1;
          }
        }
LAB_0032df84:
      }
      face->num_tables = entry.Length._4_2_;
      FT_Stream_ExitFrame((FT_Stream)sfnt.offset);
    }
  }
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_font_dir( TT_Face    face,
                         FT_Stream  stream )
  {
    SFNT_HeaderRec  sfnt;
    FT_Error        error;
    FT_Memory       memory = stream->memory;
    FT_UShort       nn, valid_entries = 0;

    static const FT_Frame_Field  offset_table_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  SFNT_HeaderRec

      FT_FRAME_START( 8 ),
        FT_FRAME_USHORT( num_tables ),
        FT_FRAME_USHORT( search_range ),
        FT_FRAME_USHORT( entry_selector ),
        FT_FRAME_USHORT( range_shift ),
      FT_FRAME_END
    };


    FT_TRACE2(( "tt_face_load_font_dir: %p\n", (void *)face ));

    /* read the offset table */

    sfnt.offset = FT_STREAM_POS();

    if ( FT_READ_ULONG( sfnt.format_tag )                    ||
         FT_STREAM_READ_FIELDS( offset_table_fields, &sfnt ) )
      goto Exit;

    /* many fonts don't have these fields set correctly */
#if 0
    if ( sfnt.search_range != 1 << ( sfnt.entry_selector + 4 )        ||
         sfnt.search_range + sfnt.range_shift != sfnt.num_tables << 4 )
      return FT_THROW( Unknown_File_Format );
#endif

    /* load the table directory */

    FT_TRACE2(( "-- Number of tables: %10hu\n",   sfnt.num_tables ));
    FT_TRACE2(( "-- Format version:   0x%08lx\n", sfnt.format_tag ));

    if ( sfnt.format_tag != TTAG_OTTO )
    {
      /* check first */
      error = check_table_dir( &sfnt, stream, &valid_entries );
      if ( error )
      {
        FT_TRACE2(( "tt_face_load_font_dir:"
                    " invalid table directory for TrueType\n" ));
        goto Exit;
      }
    }
    else
    {
      valid_entries = sfnt.num_tables;
      if ( !valid_entries )
      {
        FT_TRACE2(( "tt_face_load_font_dir: no valid tables found\n" ));
        error = FT_THROW( Unknown_File_Format );
        goto Exit;
      }
    }

    face->num_tables = valid_entries;
    face->format_tag = sfnt.format_tag;

    if ( FT_QNEW_ARRAY( face->dir_tables, face->num_tables ) )
      goto Exit;

    if ( FT_STREAM_SEEK( sfnt.offset + 12 )      ||
         FT_FRAME_ENTER( sfnt.num_tables * 16L ) )
      goto Exit;

    FT_TRACE2(( "\n" ));
    FT_TRACE2(( "  tag    offset    length   checksum\n" ));
    FT_TRACE2(( "  ----------------------------------\n" ));

    valid_entries = 0;
    for ( nn = 0; nn < sfnt.num_tables; nn++ )
    {
      TT_TableRec  entry;
      FT_UShort    i;
      FT_Bool      duplicate;


      entry.Tag      = FT_GET_TAG4();
      entry.CheckSum = FT_GET_ULONG();
      entry.Offset   = FT_GET_ULONG();
      entry.Length   = FT_GET_ULONG();

      /* ignore invalid tables that can't be sanitized */

      if ( entry.Offset > stream->size )
        continue;
      else if ( entry.Length > stream->size - entry.Offset )
      {
        if ( entry.Tag == TTAG_hmtx ||
             entry.Tag == TTAG_vmtx )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          FT_ULong  old_length = entry.Length;
#endif


          /* make metrics table length a multiple of 4 */
          entry.Length = ( stream->size - entry.Offset ) & ~3U;

          FT_TRACE2(( "  %c%c%c%c  %08lx  %08lx  %08lx"
                      " (sanitized; original length %08lx)",
                      (FT_Char)( entry.Tag >> 24 ),
                      (FT_Char)( entry.Tag >> 16 ),
                      (FT_Char)( entry.Tag >> 8  ),
                      (FT_Char)( entry.Tag       ),
                      entry.Offset,
                      entry.Length,
                      entry.CheckSum,
                      old_length ));
        }
        else
          continue;
      }
#ifdef FT_DEBUG_LEVEL_TRACE
      else
        FT_TRACE2(( "  %c%c%c%c  %08lx  %08lx  %08lx",
                    (FT_Char)( entry.Tag >> 24 ),
                    (FT_Char)( entry.Tag >> 16 ),
                    (FT_Char)( entry.Tag >> 8  ),
                    (FT_Char)( entry.Tag       ),
                    entry.Offset,
                    entry.Length,
                    entry.CheckSum ));
#endif

      /* ignore duplicate tables – the first one wins */
      duplicate = 0;
      for ( i = 0; i < valid_entries; i++ )
      {
        if ( face->dir_tables[i].Tag == entry.Tag )
        {
          duplicate = 1;
          break;
        }
      }
      if ( duplicate )
      {
        FT_TRACE2(( "  (duplicate, ignored)\n" ));
        continue;
      }
      else
      {
        FT_TRACE2(( "\n" ));

        /* we finally have a valid entry */
        face->dir_tables[valid_entries++] = entry;
      }
    }

    /* final adjustment to number of tables */
    face->num_tables = valid_entries;

    FT_FRAME_EXIT();

    FT_TRACE2(( "table directory loaded\n" ));
    FT_TRACE2(( "\n" ));

  Exit:
    return error;
  }